

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

word Nf_MatchRef_rec(Nf_Man_t *p,int i,int c,Nf_Mat_t *pM,word Required,Vec_Int_t *vBackup)

{
  bool bVar1;
  int iVar2;
  Nf_Mat_t *pNVar3;
  int *piVar4;
  int *piVar5;
  word wVar6;
  Mio_Cell2_t *pMVar7;
  int *pCut;
  int local_50;
  int fCompl;
  int iVar;
  int k;
  word ReqFanin;
  word Area;
  Vec_Int_t *vBackup_local;
  word Required_local;
  Nf_Mat_t *pM_local;
  int c_local;
  int i_local;
  Nf_Man_t *p_local;
  
  ReqFanin = 0;
  if (-1 < *(int *)pM) {
    __assert_fail("pM->fBest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x6ba,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)"
                 );
  }
  if (pM->D <= Required) {
    if ((*(uint *)pM >> 0x1e & 1) == 0) {
      iVar2 = Nf_ObjCutSetId(p,i);
      if (iVar2 == 0) {
        p_local = (Nf_Man_t *)0x0;
      }
      else {
        piVar4 = Nf_ObjCutSet(p,i);
        piVar4 = Nf_CutFromHandle(piVar4,*(uint *)pM >> 0x14 & 0x3ff);
        fCompl = 0;
        while( true ) {
          iVar2 = Nf_CutSize(piVar4);
          bVar1 = false;
          if (fCompl < iVar2) {
            piVar5 = Nf_CutLeaves(piVar4);
            iVar2 = Nf_CfgVar(pM->Cfg,fCompl);
            local_50 = piVar5[iVar2];
            bVar1 = false;
            if (local_50 != 0) {
              pCut._4_4_ = Nf_CfgCompl(pM->Cfg,fCompl);
              bVar1 = true;
            }
          }
          if (!bVar1) break;
          pMVar7 = Nf_ManCell(p,*(uint *)pM & 0xfffff);
          wVar6 = pMVar7->Delays[fCompl];
          if (vBackup != (Vec_Int_t *)0x0) {
            iVar2 = Abc_Var2Lit(local_50,pCut._4_4_);
            Vec_IntPush(vBackup,iVar2);
          }
          iVar2 = Nf_ObjMapRefNum(p,local_50,pCut._4_4_);
          if (iVar2 < 0) {
            __assert_fail("Nf_ObjMapRefNum(p, iVar, fCompl) >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x6ce,
                          "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)"
                         );
          }
          iVar2 = Nf_ObjMapRefInc(p,local_50,pCut._4_4_);
          if (iVar2 == 0) {
            pNVar3 = Nf_ObjMatchD(p,local_50,pCut._4_4_);
            wVar6 = Nf_MatchRef_rec(p,local_50,pCut._4_4_,pNVar3,Required - wVar6,vBackup);
            ReqFanin = wVar6 + ReqFanin;
          }
          fCompl = fCompl + 1;
        }
        pMVar7 = Nf_ManCell(p,*(uint *)pM & 0xfffff);
        p_local = (Nf_Man_t *)(ReqFanin + pMVar7->Area);
      }
    }
    else {
      wVar6 = p->InvDelay;
      if (vBackup != (Vec_Int_t *)0x0) {
        iVar2 = Abc_Var2Lit(i,(uint)((c != 0 ^ 0xffU) & 1));
        Vec_IntPush(vBackup,iVar2);
      }
      iVar2 = Nf_ObjMapRefNum(p,i,(uint)((c != 0 ^ 0xffU) & 1));
      if (iVar2 < 0) {
        __assert_fail("Nf_ObjMapRefNum(p, i, !c) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                      ,0x6c1,
                      "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)");
      }
      iVar2 = Nf_ObjMapRefInc(p,i,(uint)((c != 0 ^ 0xffU) & 1));
      if (iVar2 == 0) {
        pNVar3 = Nf_ObjMatchD(p,i,(uint)((c != 0 ^ 0xffU) & 1));
        ReqFanin = Nf_MatchRef_rec(p,i,(uint)((c != 0 ^ 0xffU) & 1),pNVar3,Required - wVar6,vBackup)
        ;
      }
      p_local = (Nf_Man_t *)(ReqFanin + p->InvArea);
    }
    return (word)p_local;
  }
  __assert_fail("pM->D <= Required",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                ,0x6bb,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)");
}

Assistant:

word Nf_MatchRef_rec( Nf_Man_t * p, int i, int c, Nf_Mat_t * pM, word Required, Vec_Int_t * vBackup )
{
    word Area = 0, ReqFanin;
    int k, iVar, fCompl, * pCut;
    assert( pM->fBest );
    assert( pM->D <= Required );
    if ( pM->fCompl )
    {
        ReqFanin = Required - p->InvDelay;
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(i, !c) );
        assert( Nf_ObjMapRefNum(p, i, !c) >= 0 );
        if ( !Nf_ObjMapRefInc(p, i, !c) )
            Area += Nf_MatchRef_rec( p, i, !c, Nf_ObjMatchD(p, i, !c), ReqFanin, vBackup );
        return Area + p->InvArea;
    }
    if ( Nf_ObjCutSetId(p, i) == 0 )
        return 0;
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        ReqFanin = Required - Nf_ManCell(p, pM->Gate)->Delays[k];
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(iVar, fCompl) );
        assert( Nf_ObjMapRefNum(p, iVar, fCompl) >= 0 );
        if ( !Nf_ObjMapRefInc(p, iVar, fCompl) )
            Area += Nf_MatchRef_rec( p, iVar, fCompl, Nf_ObjMatchD(p, iVar, fCompl), ReqFanin, vBackup );
    }
    return Area + Nf_ManCell(p, pM->Gate)->Area;
}